

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O2

void __thiscall
sglr::Context::readPixels(Context *this,Surface *dst,int x,int y,int width,int height)

{
  PixelBufferAccess PStack_58;
  
  tcu::Surface::setSize(dst,width,height);
  tcu::Surface::getAccess(&PStack_58,dst);
  (*this->_vptr_Context[0x78])
            (this,(ulong)(uint)x,(ulong)(uint)y,width,height,0x1908,0x1401,
             PStack_58.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

void Context::readPixels (tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	readPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}